

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::OurReader::addComment(OurReader *this,Location begin,Location end,CommentPlacement placement)

{
  undefined4 in_register_0000000c;
  string local_50;
  string *local_30;
  string *normalized;
  Location pCStack_20;
  CommentPlacement placement_local;
  Location end_local;
  Location begin_local;
  OurReader *this_local;
  
  normalized._4_4_ = placement;
  pCStack_20 = end;
  end_local = begin;
  begin_local = (Location)this;
  if ((this->collectComments_ & 1U) == 0) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kong36088[P]LeetCodeLib/lib/jsoncpp.cpp"
                  ,0x61f,"void Json::OurReader::addComment(Location, Location, CommentPlacement)");
  }
  normalizeEOL_abi_cxx11_
            (&local_50,(Json *)begin,end,(Location)CONCAT44(in_register_0000000c,placement));
  local_30 = &local_50;
  if (normalized._4_4_ == commentAfterOnSameLine) {
    if (this->lastValue_ == (Value *)0x0) {
      __assert_fail("lastValue_ != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kong36088[P]LeetCodeLib/lib/jsoncpp.cpp"
                    ,0x622,"void Json::OurReader::addComment(Location, Location, CommentPlacement)")
      ;
    }
    Value::setComment(this->lastValue_,local_30,commentAfterOnSameLine);
  }
  else {
    std::__cxx11::string::operator+=((string *)&this->commentsBefore_,(string *)local_30);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
OurReader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  const JSONCPP_STRING& normalized = normalizeEOL(begin, end);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(normalized, placement);
  } else {
    commentsBefore_ += normalized;
  }
}